

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitBinary(InternalAnalyzer *this,Binary *curr)

{
  bool bVar1;
  long lVar2;
  
  if (((curr->op < AndInt64) && ((0xf0000078U >> (curr->op & RemUInt64) & 1) != 0)) &&
     (((curr->right->_id != ConstId ||
       (bVar1 = Literal::isZero((Literal *)(curr->right + 1)), bVar1)) ||
      (((curr->op == DivSInt64 || (curr->op == DivSInt32)) &&
       (lVar2 = ::wasm::Literal::getInteger(), lVar2 == -1)))))) {
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
      switch (curr->op) {
        case DivSInt32:
        case DivUInt32:
        case RemSInt32:
        case RemUInt32:
        case DivSInt64:
        case DivUInt64:
        case RemSInt64:
        case RemUInt64: {
          // div and rem may contain implicit trap only if RHS is
          // non-constant or constant which equal zero or -1 for
          // signed divisions. Reminder traps only with zero
          // divider.
          if (auto* c = curr->right->dynCast<Const>()) {
            if (c->value.isZero()) {
              parent.implicitTrap = true;
            } else if ((curr->op == DivSInt32 || curr->op == DivSInt64) &&
                       c->value.getInteger() == -1LL) {
              parent.implicitTrap = true;
            }
          } else {
            parent.implicitTrap = true;
          }
          break;
        }
        default: {
        }
      }
    }